

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_map_forEach(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int64_t iVar1;
  JSRuntime *pJVar2;
  long lVar3;
  long *plVar4;
  JSValue this_obj;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar9;
  long *plVar10;
  JSValueUnion JVar11;
  int64_t iVar12;
  long *plVar13;
  JSValue func_obj;
  JSValue v;
  JSValue v_00;
  JSValue JVar14;
  JSValue JVar15;
  JSValueUnion local_b0;
  ulong local_a0;
  int64_t local_98;
  JSValueUnion local_88;
  long lStack_80;
  JSValueUnion local_78;
  long lStack_70;
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_50;
  int64_t local_48;
  JSValueUnion local_40;
  int64_t local_38;
  JSValueUnion JVar8;
  
  local_38 = this_val.tag;
  local_40 = this_val.u;
  pvVar6 = JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  iVar12 = 6;
  if (pvVar6 != (void *)0x0) {
    JVar11 = (JSValueUnion)(argv->u).ptr;
    iVar1 = argv->tag;
    if (argc < 2) {
      local_98 = 3;
      uVar7 = 0;
      local_a0 = 0;
    }
    else {
      local_98 = argv[1].tag;
      local_a0 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
      uVar7 = (ulong)argv[1].u.ptr & 0xffffffff;
    }
    iVar5 = check_function(ctx,*argv);
    if (iVar5 == 0) {
      if (*(long **)((long)pvVar6 + 0x10) == (long *)((long)pvVar6 + 8)) {
        uVar7 = 0;
        uVar9 = 0;
        iVar12 = 3;
      }
      else {
        plVar13 = *(long **)((long)pvVar6 + 0x10);
        local_50 = JVar11;
        local_48 = iVar1;
        do {
          if (*(int *)((long)plVar13 + -0x14) == 0) {
            *(int *)(plVar13 + -3) = (int)plVar13[-3] + 1;
            local_78 = (JSValueUnion)((JSValueUnion *)(plVar13 + 4))->ptr;
            lStack_70 = plVar13[5];
            if (0xfffffff4 < (uint)lStack_70) {
              *(int *)local_78.ptr = *local_78.ptr + 1;
            }
            local_88 = local_78;
            lStack_80 = lStack_70;
            if (magic == 0) {
              local_88 = (JSValueUnion)((JSValueUnion *)(plVar13 + 6))->ptr;
              lStack_80 = plVar13[7];
              if (0xfffffff4 < (uint)lStack_80) {
                *(int *)local_88.ptr = *local_88.ptr + 1;
              }
            }
            local_68 = local_40;
            local_60 = local_38;
            local_b0.float64 = local_88.float64 & 0xffffffff00000000;
            this_obj.tag = local_98;
            this_obj.u.ptr = (void *)(local_a0 | uVar7);
            JVar15.tag = 3;
            JVar15.u.ptr = local_b0.ptr;
            func_obj.tag = local_48;
            func_obj.u.float64 = JVar11.float64;
            JVar15 = JS_CallInternal(ctx,func_obj,this_obj,JVar15,3,(JSValue *)&local_88,2);
            iVar12 = JVar15.tag;
            JVar8 = JVar15.u;
            if ((0xfffffff4 < (uint)lStack_80) &&
               (iVar5 = *local_88.ptr, *(int *)local_88.ptr = iVar5 + -1, iVar5 < 2)) {
              v.tag = lStack_80;
              v.u.ptr = local_88.ptr;
              __JS_FreeValueRT(ctx->rt,v);
            }
            if (((magic == 0) && (0xfffffff4 < (uint)lStack_70)) &&
               (iVar5 = *local_78.ptr, *(int *)local_78.ptr = iVar5 + -1, iVar5 < 2)) {
              v_00.tag = lStack_70;
              v_00.u.ptr = local_78.ptr;
              __JS_FreeValueRT(ctx->rt,v_00);
            }
            plVar10 = (long *)plVar13[1];
            pJVar2 = ctx->rt;
            plVar4 = plVar13 + -3;
            *(int *)plVar4 = (int)*plVar4 + -1;
            if ((int)*plVar4 == 0) {
              lVar3 = *plVar13;
              plVar4 = (long *)plVar13[1];
              *(long **)(lVar3 + 8) = plVar4;
              *plVar4 = lVar3;
              *plVar13 = 0;
              plVar13[1] = 0;
              (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,plVar13 + -3);
            }
            if ((uint)JVar15.tag == 6) {
              uVar9 = (ulong)JVar8.ptr & 0xffffffff00000000;
              uVar7 = (ulong)JVar8.ptr & 0xffffffff;
              goto LAB_00148093;
            }
            JVar11 = local_50;
            if ((0xfffffff4 < (uint)JVar15.tag) &&
               (iVar5 = *JVar8.ptr, *(int *)JVar8.ptr = iVar5 + -1, iVar5 < 2)) {
              __JS_FreeValueRT(ctx->rt,JVar15);
              JVar11 = local_50;
            }
          }
          else {
            plVar10 = (long *)plVar13[1];
          }
          plVar13 = plVar10;
        } while (plVar10 != (long *)((long)pvVar6 + 8));
        uVar9 = 0;
        iVar12 = 3;
        uVar7 = 0;
      }
      goto LAB_00148093;
    }
  }
  uVar7 = 0;
  uVar9 = 0;
LAB_00148093:
  JVar14.u.ptr = (void *)(uVar7 | uVar9);
  JVar14.tag = iVar12;
  return JVar14;
}

Assistant:

static JSValue js_map_forEach(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSValueConst func, this_arg;
    JSValue ret, args[3];
    struct list_head *el;
    JSMapRecord *mr;

    if (!s)
        return JS_EXCEPTION;
    func = argv[0];
    if (argc > 1)
        this_arg = argv[1];
    else
        this_arg = JS_UNDEFINED;
    if (check_function(ctx, func))
        return JS_EXCEPTION;
    /* Note: the list can be modified while traversing it, but the
       current element is locked */
    el = s->records.next;
    while (el != &s->records) {
        mr = list_entry(el, JSMapRecord, link);
        if (!mr->empty) {
            mr->ref_count++;
            /* must duplicate in case the record is deleted */
            args[1] = JS_DupValue(ctx, mr->key);
            if (magic)
                args[0] = args[1];
            else
                args[0] = JS_DupValue(ctx, mr->value);
            args[2] = (JSValue)this_val;
            ret = JS_Call(ctx, func, this_arg, 3, (JSValueConst *)args);
            JS_FreeValue(ctx, args[0]);
            if (!magic)
                JS_FreeValue(ctx, args[1]);
            el = el->next;
            map_decref_record(ctx->rt, mr);
            if (JS_IsException(ret))
                return ret;
            JS_FreeValue(ctx, ret);
        } else {
            el = el->next;
        }
    }
    return JS_UNDEFINED;
}